

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer_function_widget.cpp
# Opt level: O0

void __thiscall
tfnw::Colormap::Colormap
          (Colormap *this,string *name,vector<unsigned_char,_std::allocator<unsigned_char>_> *img,
          ColorSpace color_space)

{
  ColorSpace color_space_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *img_local;
  string *name_local;
  Colormap *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->colormap,img);
  this->color_space = color_space;
  return;
}

Assistant:

Colormap::Colormap(const std::string &name,
                   const std::vector<uint8_t> &img,
                   const ColorSpace color_space)
    : name(name), colormap(img), color_space(color_space)
{
}